

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

void google::protobuf::compiler::protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::TableStruct
     ::InitDefaultsImpl(void)

{
  internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
            );
  internal::InitProtobufDefaults();
  protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  internal::ExplicitlyConstructed<google::protobuf::compiler::Version>::DefaultConstruct
            ((ExplicitlyConstructed<google::protobuf::compiler::Version> *)
             &_Version_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::compiler::CodeGeneratorRequest>::
  DefaultConstruct((ExplicitlyConstructed<google::protobuf::compiler::CodeGeneratorRequest> *)
                   &_CodeGeneratorRequest_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::compiler::CodeGeneratorResponse_File>::
  DefaultConstruct((ExplicitlyConstructed<google::protobuf::compiler::CodeGeneratorResponse_File> *)
                   &_CodeGeneratorResponse_File_default_instance_);
  internal::ExplicitlyConstructed<google::protobuf::compiler::CodeGeneratorResponse>::
  DefaultConstruct((ExplicitlyConstructed<google::protobuf::compiler::CodeGeneratorResponse> *)
                   &_CodeGeneratorResponse_default_instance_);
  _DAT_0042eca8 = &_Version_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::google::protobuf::protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  _Version_default_instance_.DefaultConstruct();
  _CodeGeneratorRequest_default_instance_.DefaultConstruct();
  _CodeGeneratorResponse_File_default_instance_.DefaultConstruct();
  _CodeGeneratorResponse_default_instance_.DefaultConstruct();
  _CodeGeneratorRequest_default_instance_.get_mutable()->compiler_version_ = const_cast< ::google::protobuf::compiler::Version*>(
      ::google::protobuf::compiler::Version::internal_default_instance());
}